

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::findRecursively
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,
          ArrayRef<llvm::dwarf::Attribute> Attrs)

{
  size_t *this_00;
  DWARFDebugInfoEntry **V;
  pair<llvm::NoneType,_bool> pVar1;
  undefined1 local_d8 [8];
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> Seen;
  DWARFDie Die;
  DWARFDie D;
  vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> Worklist;
  
  D.Die = (DWARFDebugInfoEntry *)0x0;
  Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
            ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)&D.Die,this);
  local_d8 = (undefined1  [8])
             &Seen.Vector.super_SmallVectorImpl<llvm::DWARFDie>.
              super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
  Seen.Vector.super_SmallVectorImpl<llvm::DWARFDie>.
  super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.BeginX =
       (void *)0x300000000;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&Seen.Set;
  Seen.Set._M_t._M_impl._0_4_ = 0;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8,this);
  this_00 = &Seen.Set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  V = &Die.Die;
  while (D.Die != (DWARFDebugInfoEntry *)
                  Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
    Seen.Set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                 _M_impl.super__Vector_impl_data._M_start[-1].U;
    Die.U = (DWARFUnit *)
            Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
            super__Vector_impl_data._M_start[-1].Die;
    Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
    super__Vector_impl_data._M_start =
         Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    if (((DWARFUnit *)Seen.Set._M_t._M_impl.super__Rb_tree_header._M_node_count != (DWARFUnit *)0x0)
       && (Die.U != (DWARFUnit *)0x0)) {
      find(__return_storage_ptr__,(DWARFDie *)this_00,Attrs);
      if ((__return_storage_ptr__->Storage).hasVal == true) goto LAB_00d953f5;
      join_0x00000010_0x00000000_ =
           getAttributeValueAsReferencedDie((DWARFDie *)this_00,DW_AT_abstract_origin);
      if (Die._16_8_ != (DWARFDebugInfoEntry *)0x0 && Die.Die != (DWARFUnit *)0x0) {
        pVar1 = SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
                          ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8,
                           (DWARFDie *)V);
        if (((ulong)pVar1 & 0x100000000) != 0) {
          std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
                    ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)&D.Die,
                     (value_type *)V);
        }
      }
      join_0x00000010_0x00000000_ =
           getAttributeValueAsReferencedDie((DWARFDie *)this_00,DW_AT_specification);
      if (Die._16_8_ != (DWARFDebugInfoEntry *)0x0 && Die.Die != (DWARFUnit *)0x0) {
        pVar1 = SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
                          ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8,
                           (DWARFDie *)V);
        if (((ulong)pVar1 & 0x100000000) != 0) {
          std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
                    ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)&D.Die,
                     (value_type *)V);
        }
      }
    }
  }
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
LAB_00d953f5:
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::~SmallSet
            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8);
  std::_Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::~_Vector_base
            ((_Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)&D.Die);
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
DWARFDie::findRecursively(ArrayRef<dwarf::Attribute> Attrs) const {
  std::vector<DWARFDie> Worklist;
  Worklist.push_back(*this);

  // Keep track if DIEs already seen to prevent infinite recursion.
  // Empirically we rarely see a depth of more than 3 when dealing with valid
  // DWARF. This corresponds to following the DW_AT_abstract_origin and
  // DW_AT_specification just once.
  SmallSet<DWARFDie, 3> Seen;
  Seen.insert(*this);

  while (!Worklist.empty()) {
    DWARFDie Die = Worklist.back();
    Worklist.pop_back();

    if (!Die.isValid())
      continue;

    if (auto Value = Die.find(Attrs))
      return Value;

    if (auto D = Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      if (Seen.insert(D).second)
        Worklist.push_back(D);

    if (auto D = Die.getAttributeValueAsReferencedDie(DW_AT_specification))
      if (Seen.insert(D).second)
        Worklist.push_back(D);
  }

  return None;
}